

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PNGImage.cpp
# Opt level: O0

void __thiscall PNGImage::PNGImage(PNGImage *this,istream *input)

{
  uchar *__first;
  byte bVar1;
  int iVar2;
  runtime_error *prVar3;
  __jmp_buf_tag *__env;
  long lVar4;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a90;
  const_iterator local_a88;
  int local_a80;
  uint local_a7c;
  int y;
  uint row_size_bytes;
  uint8_t **tempi;
  string local_a68 [32];
  stringstream local_a48 [8];
  stringstream what_5;
  ostream local_a38 [383];
  undefined1 local_8b9;
  string local_8b8 [32];
  stringstream local_898 [8];
  stringstream what_4;
  ostream local_888 [383];
  undefined1 local_709;
  string local_708 [32];
  stringstream local_6e8 [8];
  stringstream what_3;
  ostream local_6d8 [383];
  undefined1 local_559;
  string local_558 [32];
  stringstream local_538 [8];
  stringstream what_2;
  ostream local_528 [383];
  undefined1 local_3a9;
  string local_3a8 [32];
  stringstream local_388 [8];
  stringstream what_1;
  ostream local_378 [383];
  undefined1 local_1f9;
  string local_1f8 [32];
  stringstream local_1d8 [8];
  stringstream what;
  ostream local_1c8 [392];
  undefined1 local_40 [8];
  png_byte sig [8];
  png_infop endinfo;
  png_infop info;
  png_structp png;
  istream *piStack_18;
  int ctype;
  istream *input_local;
  PNGImage *this_local;
  
  this->_vptr_PNGImage = (_func_int **)&PTR__PNGImage_0013dd50;
  piStack_18 = input;
  input_local = (istream *)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->pixels);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->palette);
  info = (png_infop)0x0;
  endinfo = (png_infop)0x0;
  sig[0] = '\0';
  sig[1] = '\0';
  sig[2] = '\0';
  sig[3] = '\0';
  sig[4] = '\0';
  sig[5] = '\0';
  sig[6] = '\0';
  sig[7] = '\0';
  std::istream::read((char *)piStack_18,(long)local_40);
  iVar2 = png_sig_cmp(local_40,0,8);
  if (iVar2 != 0) {
    std::__cxx11::stringstream::stringstream(local_1d8);
    std::operator<<(local_1c8,"Bad PNG");
    local_1f9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1f8);
    local_1f9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  info = (png_infop)png_create_read_struct("1.6.37",0,0);
  if (info == (png_infop)0x0) {
    std::__cxx11::stringstream::stringstream(local_388);
    std::operator<<(local_378,"Couldn\'t create png_struct");
    local_3a9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_3a8);
    local_3a9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  endinfo = (png_infop)png_create_info_struct(info);
  if (endinfo == (png_infop)0x0) {
    std::__cxx11::stringstream::stringstream(local_538);
    std::operator<<(local_528,"Couldn\'t create info_struct");
    local_559 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_558);
    local_559 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sig = (png_byte  [8])png_create_info_struct(info);
  if (sig != (png_byte  [8])0x0) {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(info,longjmp,200);
    iVar2 = _setjmp(__env);
    if (iVar2 != 0) {
      std::__cxx11::stringstream::stringstream(local_898);
      std::operator<<(local_888,"Internal libpng error");
      local_8b9 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar3,local_8b8);
      local_8b9 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    png_set_read_fn(info,piStack_18,read_data_istream);
    png_set_sig_bytes(info,8);
    png_read_png(info,endinfo,0,0);
    iVar2 = png_get_image_width(info,endinfo);
    this->width = iVar2;
    iVar2 = png_get_image_height(info,endinfo);
    this->height = iVar2;
    bVar1 = png_get_bit_depth(info,endinfo);
    this->bpp = (uint)bVar1;
    bVar1 = png_get_color_type(info,endinfo);
    png._4_4_ = (uint)bVar1;
    if (png._4_4_ != 3) {
      if (png._4_4_ == 2) {
        this->bpp = this->bpp * 3;
      }
      else if (png._4_4_ == 6) {
        this->bpp = this->bpp << 2;
      }
      lVar4 = png_get_rowbytes(info,endinfo);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                (&this->pixels,lVar4 * this->height);
      _y = png_get_rows(info,endinfo);
      local_a7c = png_get_rowbytes(info,endinfo);
      for (local_a80 = 0; local_a80 < this->height; local_a80 = local_a80 + 1) {
        local_a90._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->pixels)
        ;
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_a88,&local_a90);
        __first = *(uchar **)(_y + (long)local_a80 * 8);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->pixels,local_a88,
                   __first,__first + local_a7c);
      }
      png_destroy_read_struct(&info,&endinfo,sig);
      return;
    }
    std::__cxx11::stringstream::stringstream(local_a48);
    std::operator<<(local_a38,
                    "Can\'t handle images with a color palette. Change the color mode of the image to RGB."
                   );
    tempi._7_1_ = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_a68);
    tempi._7_1_ = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_6e8);
  std::operator<<(local_6d8,"Couldn\'t create (end) info_struct");
  local_709 = 1;
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(prVar3,local_708);
  local_709 = 0;
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PNGImage::PNGImage(std::istream &input) {
    int ctype;

    // Represents the png itself. Gets passed to pretty much every libpng function.
    // A pointer since it will be allocated by the library code.
    png_structp png = NULL;

    // Holds information about the png such as dimensions, etc.
    // A pointer since it will be allocated by the library code.
    png_infop info = NULL;

    // For some reason libpng wants another one referred to as "end info".
    // A pointer since it will be allocated by the library code.
    png_infop endinfo = NULL;

    // Storage for the first eight bytes of the file with which to check the png signature.
    png_byte sig[8];

    // Read the first eight bytes of the file to check its info.
    input.read(reinterpret_cast<char *>(sig), 8);

    // Check to see if it's a good png.
    // int png_sig_cmp (png_bytep sig, png_size_t start, png_size_t num_to_check);
    if (png_sig_cmp(sig, 0, 8)) {
        // Not a good png, the signature is messed up or it's not really a png.
        stringstream what;
        what<<"Bad PNG";
        throw runtime_error(what.str());
    }

    // Initialize the png struct for reading from files. This allocates memory.
    // png_structp png_create_read_struct (png_const_charp user_png_ver, png_voidp error_ptr, png_error_ptr error_fn, png_error_ptr warn_fn);
    png = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);

    if (!png) {
        // For some reason the png_struct wasn't created.
        stringstream what;
        what<<"Couldn't create png_struct";
        throw runtime_error(what.str());
    }

    // Initialize the info struct. This allocates memory.
    // png_infop png_create_info_struct (png_structp png_ptr);
    info = png_create_info_struct(png);

    if (!info) {
        // For some reason the info_struct wasn't created.
        stringstream what;
        what<<"Couldn't create info_struct";
        throw runtime_error(what.str());
    }

    // Initialize the info struct again? The manual does it in the example code
    // and doesn't really give any reasons.
    // png_infop png_create_info_struct (png_structp png_ptr);
    endinfo = png_create_info_struct(png);

    if (!endinfo) {
        // For some reason the (end) info_struct wasn't created.
        stringstream what;
        what<<"Couldn't create (end) info_struct";
        throw runtime_error(what.str());
    }

    // Handle interal png errors.
    // int setjmp(jmp_buf env ); from C standard
    // jmp_buf png_jmpbuf(png_structp png);
    if (setjmp(png_jmpbuf(png))) {
        // Using ancient crappy C stuff, this code below will run if libpng has an error.
        // Essentially it's like the catch part of a try-catch.
        stringstream what;
        what<<"Internal libpng error";
        throw runtime_error(what.str());
    }

    // Set the read function to use the istream
    png_set_read_fn(png, static_cast<png_voidp>(&input), read_data_istream);

    // Tell the library that I already read eight bytes from the file and that
    // the pointer has moved.
    // void png_set_sig_bytes (png_structp png_ptr, int num_bytes);
    png_set_sig_bytes(png, 8);

    // Actually reads all of the file.
    // void png_read_png (png_structp png_ptr, png_infop info_ptr, int transforms, png_voidp params);
    png_read_png(png, info, 0, NULL);

    // Pull information from the png.
    //png_uint_32 png_get_image_width (png_structp png_ptr, png_infop info_ptr);
    //png_uint_32 png_get_image_height (png_structp png_ptr, png_infop info_ptr);
    //png_byte png_get_bit_depth (png_structp png_ptr, png_infop info_ptr);
    //png_byte png_get_color_type (png_structp png_ptr, png_infop info_ptr);
    //types can be:
    //PNG_COLOR_TYPE_GRAY, PNG_COLOR_TYPE_PALETTE, PNG_COLOR_TYPE_RGB, PNG_COLOR_TYPE_RGB_ALPHA , or PNG_COLOR_TYPE_GRAY_ALPHA
    this->width = (int) png_get_image_width(png, info);
    this->height = (int) png_get_image_height(png, info);
    this->bpp = (int) png_get_bit_depth(png, info);
    ctype = (int) png_get_color_type(png, info);
    if (ctype == PNG_COLOR_TYPE_PALETTE) {
        // Don't handle images with a color palette.
        stringstream what;
        what<<"Can't handle images with a color palette. Change the color mode of the image to RGB.";
        throw runtime_error(what.str());
    }
    if (ctype == PNG_COLOR_TYPE_RGB)
        this->bpp *= 3;
    else if (ctype == PNG_COLOR_TYPE_RGB_ALPHA)
        this->bpp *= 4;

    // Allocate memory for the pixel data.
    this->pixels.reserve(png_get_rowbytes(png, info) * this->height);
    // Find the pointer to the pixel rows.
    // png_bytepp png_get_rows (png_structp png_ptr, png_infop info_ptr);
    uint8_t** tempi = png_get_rows(png, info);

    unsigned int row_size_bytes = png_get_rowbytes(png, info);
    // Copy the pixels into our own array.
    for (int y = 0; y < this->height; y++) {
        this->pixels.insert(pixels.end(), tempi[y], tempi[y]+row_size_bytes);
    }

    // Clean up.
    png_destroy_read_struct(&png, &info, &endinfo);

}